

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>::
find<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::ReadableDirectory_const*&>
          (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks> *this,
          ArrayPtr<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> table,
          ReadableDirectory **params)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  ArrayDisposer *pAVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  uint hash;
  Entry *pEVar6;
  uint uVar7;
  size_t *in_R8;
  uint *puVar8;
  Maybe<unsigned_long> MVar9;
  
  pEVar6 = table.ptr;
  pAVar4 = (pEVar6->value).content.disposer;
  aVar5.value = table.size_;
  if (pAVar4 != (ArrayDisposer *)0x0) {
    hash = (uint)((int)(*in_R8 >> 0x20) * 0xbfe3 + (int)*in_R8 != 0);
    uVar2 = kj::_::chooseBucket(hash,(uint)pAVar4);
    sVar1 = (pEVar6->value).content.size_;
    uVar3 = (ulong)uVar2;
    uVar7 = *(uint *)(sVar1 + 4 + uVar3 * 8);
    aVar5 = extraout_RDX;
    if (uVar7 != 0) {
      puVar8 = (uint *)(sVar1 + uVar3 * 8);
      aVar5.value = *in_R8;
      do {
        if (((uVar7 != 1) && (*puVar8 == hash)) &&
           (*(size_t *)(table.size_ + (ulong)(uVar7 - 2) * 0x20) == aVar5.value)) {
          *this = (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>)0x1;
          *(ulong *)(this + 8) = (ulong)(uVar7 - 2);
          goto LAB_00192e1f;
        }
        pAVar4 = (ArrayDisposer *)(uVar3 + 1);
        uVar3 = (ulong)pAVar4 & 0xffffffff;
        if (pAVar4 == (pEVar6->value).content.disposer) {
          uVar3 = 0;
        }
        puVar8 = (uint *)(sVar1 + uVar3 * 8);
        uVar7 = puVar8[1];
      } while (uVar7 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>)0x0;
LAB_00192e1f:
  MVar9.ptr.field_1.value = aVar5.value;
  MVar9.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar9.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }